

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O1

DWORD CorUnix::InternalWaitForMultipleObjectsEx
                (CPalThread *pThread,DWORD nCount,HANDLE *lpHandles,BOOL bWaitAll,
                DWORD dwMilliseconds,BOOL bAlertable)

{
  ulong uVar1;
  size_t szSize;
  size_t __n;
  IPalObject *pIVar2;
  undefined4 uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  DWORD DVar9;
  int iVar10;
  int *piVar11;
  ulong *puVar12;
  ulong uVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar14;
  undefined7 uVar15;
  IPalObject **ppIVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  ulong uStack_188;
  IPalObject *pIPalObjStackArray [16];
  ISynchWaitController *pISyncStackArray [16];
  uint local_7c;
  DWORD local_70;
  DWORD local_6c;
  bool fValue;
  undefined8 local_60;
  ulong local_58;
  BOOL local_4c;
  undefined4 local_48;
  uint local_44;
  uint local_40;
  int iSignaledObjIndex;
  ulong *puStack_38;
  bool fAbandoned;
  
  uVar17 = (ulong)nCount;
  local_44 = 0xffffffff;
  uVar3 = CONCAT31((int3)(nCount >> 8),bWaitAll != 0);
  iSignaledObjIndex._3_1_ = 0;
  pIPalObjStackArray[0xd] = (IPalObject *)0x0;
  pIPalObjStackArray[0xe] = (IPalObject *)0x0;
  pIPalObjStackArray[0xb] = (IPalObject *)0x0;
  pIPalObjStackArray[0xc] = (IPalObject *)0x0;
  pIPalObjStackArray[9] = (IPalObject *)0x0;
  pIPalObjStackArray[10] = (IPalObject *)0x0;
  pIPalObjStackArray[7] = (IPalObject *)0x0;
  pIPalObjStackArray[8] = (IPalObject *)0x0;
  pIPalObjStackArray[5] = (IPalObject *)0x0;
  pIPalObjStackArray[6] = (IPalObject *)0x0;
  pIPalObjStackArray[3] = (IPalObject *)0x0;
  pIPalObjStackArray[4] = (IPalObject *)0x0;
  pIPalObjStackArray[1] = (IPalObject *)0x0;
  pIPalObjStackArray[2] = (IPalObject *)0x0;
  uStack_188 = 0;
  pIPalObjStackArray[0] = (IPalObject *)0x0;
  pIPalObjStackArray[0xf] = (IPalObject *)0x0;
  if (nCount - 0x41 < 0xffffffc0) {
    if (PAL_InitializeChakraCoreCalled) {
      piVar11 = __errno_location();
      *piVar11 = 0x57;
      DVar9 = 0xffffffff;
      puVar12 = (ulong *)0x0;
      ppIVar16 = (IPalObject **)0x0;
      goto LAB_002cc3fe;
    }
    goto LAB_002cc961;
  }
  ppIVar16 = pIPalObjStackArray + 0xf;
  puStack_38 = &uStack_188;
  local_6c = dwMilliseconds;
  local_4c = bAlertable;
  if (nCount == 1) {
    local_7c = 0;
    local_48 = 0;
  }
  else {
    local_7c = 2 - (bWaitAll == 0);
    local_48 = uVar3;
    if (0x10 < nCount) {
      uVar20 = (ulong)nCount;
      __n = uVar20 * 8;
      szSize = uVar20 * 8 + 8;
      puStack_38 = (ulong *)InternalMalloc(szSize);
      local_60 = __n;
      if (puStack_38 == (ulong *)0x0) {
        puStack_38 = (ulong *)0x0;
      }
      else {
        *puStack_38 = uVar20;
        puStack_38 = puStack_38 + 1;
        memset(puStack_38,0,__n);
      }
      puVar12 = (ulong *)InternalMalloc(szSize);
      if (puVar12 == (ulong *)0x0) {
        ppIVar16 = (IPalObject **)0x0;
      }
      else {
        *puVar12 = uVar20;
        ppIVar16 = (IPalObject **)(puVar12 + 1);
        memset(ppIVar16,0,local_60);
      }
      if (puStack_38 == (ulong *)0x0 || ppIVar16 == (IPalObject **)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
        piVar11 = __errno_location();
        *piVar11 = 8;
        DVar9 = 0xffffffff;
        puVar12 = puStack_38;
        goto LAB_002cc3fe;
      }
    }
  }
  iVar6 = (**(code **)(*g_pObjectManager + 0x30))
                    (g_pObjectManager,pThread,lpHandles,nCount,&sg_aotWaitObject,0x100000,puStack_38
                    );
  if (iVar6 != 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
    piVar11 = __errno_location();
    if (iVar6 == 6) {
      *piVar11 = 6;
    }
    else {
      *piVar11 = 0x54f;
    }
    DVar9 = 0xffffffff;
    puVar12 = puStack_38;
    goto LAB_002cc3fe;
  }
  puVar12 = puStack_38;
  _fValue = ppIVar16;
  local_58 = uVar17;
  if ((byte)local_48 != '\0') {
    uVar7 = nCount - 1;
    bVar22 = uVar7 != 0;
    if (bVar22) {
      local_40 = CONCAT31(local_40._1_3_,PAL_InitializeChakraCoreCalled);
      uVar18 = 1;
      uVar20 = 0;
      do {
        uVar19 = uVar20 + 1;
        bVar21 = uVar19 < uVar17;
        if (bVar21) {
          uVar13 = uVar18;
          if (puVar12[uVar18] != puVar12[uVar20]) {
            do {
              if ((2 - uVar17) + uVar13 == 1) goto LAB_002cc346;
              uVar1 = uVar13 + 1;
              lVar4 = uVar13 + 1;
              uVar13 = uVar1;
            } while (puVar12[lVar4] != puVar12[uVar20]);
            bVar21 = uVar1 < uVar17;
          }
          local_60 = CONCAT71(local_60._1_7_,bVar22);
          if ((local_40 & 1) == 0) goto LAB_002cc961;
          piVar11 = __errno_location();
          *piVar11 = 0x57;
          puVar12 = puStack_38;
          if (bVar21) {
            DVar9 = 0xffffffff;
            if ((local_60 & 1) != 0) goto LAB_002cc3aa;
            break;
          }
        }
LAB_002cc346:
        bVar22 = uVar19 < uVar7;
        uVar18 = uVar18 + 1;
        uVar20 = uVar19;
      } while (uVar19 != uVar7);
    }
  }
  uVar17 = local_58;
  ppIVar16 = _fValue;
  iVar10 = (int)local_58;
  iVar6 = (**(code **)(*g_pSynchronizationManager + 0x28))
                    (g_pSynchronizationManager,pThread,puVar12,local_58 & 0xffffffff,_fValue);
  if (iVar6 == 0) {
    uVar14 = extraout_RDX;
    if ((local_4c == 0) ||
       (cVar5 = (**(code **)(*g_pSynchronizationManager + 0x18))(g_pSynchronizationManager,pThread),
       uVar14 = extraout_RDX_00, cVar5 == '\0')) {
      DVar9 = local_6c;
      local_44 = 0xffffffff;
      if (iVar10 < 1) {
        local_60 = (ulong)local_60._4_4_ << 0x20;
        iVar6 = 0;
      }
      else {
        uVar20 = 0;
        local_40 = 0xd;
        if ((byte)local_48 != '\0') {
          local_40 = 0;
        }
        local_60 = (ulong)local_60._4_4_ << 0x20;
        do {
          iVar6 = (**_fValue[uVar20]->_vptr_IPalObject)
                            (_fValue[uVar20],&local_70,(long)&iSignaledObjIndex + 3);
          if (iVar6 == 0) {
            uVar14 = extraout_RDX_01;
            uVar7 = 0;
            if ((char)local_70 == '\x01') {
              local_60 = CONCAT44(local_60._4_4_,(int)local_60 + 1);
              local_44 = (uint)uVar20;
              uVar7 = local_40;
            }
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
            piVar11 = __errno_location();
            *piVar11 = 0x54f;
            uVar14 = extraout_RDX_02;
            uVar7 = 0x10;
          }
          if (uVar7 != 0) {
            if (uVar7 != 0xd) {
              DVar9 = 0xffffffff;
              goto LAB_002cc66f;
            }
            break;
          }
          uVar20 = uVar20 + 1;
        } while ((uVar17 & 0xffffffff) != uVar20);
      }
      ppIVar16 = _fValue;
      uVar15 = (undefined7)((ulong)uVar14 >> 8);
      iVar10 = (int)local_58;
      if ((int)local_60 == 0) {
        local_40 = (uint)CONCAT71(uVar15,1);
      }
      else {
        local_40 = (uint)CONCAT71(uVar15,(int)local_60 < iVar10 & (byte)local_48);
      }
      if ((char)local_40 == '\0') {
        uVar7 = 0;
        if ((byte)local_48 == 0) {
          uVar7 = local_44;
        }
        iVar8 = local_44 + 1;
        if ((byte)local_48 != 0) {
          iVar8 = iVar10;
        }
        if ((int)uVar7 < 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
          piVar11 = __errno_location();
          *piVar11 = 0x54f;
LAB_002cc6cd:
          DVar9 = 0xffffffff;
        }
        else {
          if ((int)uVar7 < iVar8) {
            uVar17 = (ulong)uVar7;
            do {
              iVar6 = (*ppIVar16[uVar17]->_vptr_IPalObject[1])();
              if (iVar6 != 0) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
                piVar11 = __errno_location();
                *piVar11 = iVar6;
                goto LAB_002cc6cd;
              }
              uVar17 = uVar17 + 1;
            } while ((long)iVar8 != uVar17);
          }
          DVar9 = (uint)iSignaledObjIndex._3_1_ << 7;
        }
        if ((int)uVar7 < 0) goto LAB_002cc3aa;
      }
      else if (DVar9 == 0) {
        DVar9 = 0x102;
LAB_002cc66f:
        local_40 = 0;
      }
      else {
        DVar9 = 0xffffffff;
        if (0 < iVar10) {
          uVar20 = local_58 & 0xffffffff;
          uVar17 = 0;
          do {
            pIVar2 = ppIVar16[uVar17];
            iVar6 = (*pIVar2->_vptr_IPalObject[2])
                              (pIVar2,(ulong)local_7c,uVar17 & 0xffffffff,(ulong)(local_4c == 1));
            if (iVar6 != 0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
              piVar11 = __errno_location();
              *piVar11 = iVar6;
              iVar6 = 1;
              goto LAB_002cc6df;
            }
            uVar17 = uVar17 + 1;
          } while (uVar20 != uVar17);
          iVar6 = 0;
        }
      }
LAB_002cc6df:
      ppIVar16 = _fValue;
      if (0 < (int)local_58) {
        uVar17 = local_58 & 0xffffffff;
        uVar20 = 0;
        do {
          (*ppIVar16[uVar20]->_vptr_IPalObject[3])();
          ppIVar16[uVar20] = (IPalObject *)0x0;
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
      if (iVar6 == 0) {
        if ((char)local_40 != '\0') {
          iVar6 = (**(code **)*g_pSynchronizationManager)
                            (g_pSynchronizationManager,pThread,local_6c,local_4c == 1,0,&local_70,
                             &local_44);
          if (iVar6 == 0) {
            DVar9 = local_70;
            switch(local_70) {
            case 0:
              break;
            case 1:
              if (local_4c == 0) {
                fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                        ,0x21e);
                fprintf(_stderr,
                        "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n"
                       );
              }
              iVar10 = (**(code **)(*g_pSynchronizationManager + 0x20))
                                 (g_pSynchronizationManager,pThread);
              DVar9 = 0xc0;
              if (iVar10 != 0) {
                fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                        ,0x224);
                fprintf(_stderr,
                        "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
                       );
              }
              break;
            case 2:
              DVar9 = 0x80;
              break;
            case 3:
              DVar9 = 0x102;
              break;
            default:
              DVar9 = 0xffffffff;
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
            }
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) {
LAB_002cc961:
              abort();
            }
            piVar11 = __errno_location();
            *piVar11 = iVar6;
          }
          if (iVar6 != 0) goto LAB_002cc3aa;
        }
        if ((char)local_48 == '\0' && (DVar9 & 0xffffff7f) == 0) {
          if ((int)local_44 < 0) {
            fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                    ,0x231);
            fprintf(_stderr,
                    "Expression: 0 <= iSignaledObjIndex, Description: Failed to identify signaled/abandoned object\n"
                   );
          }
          uVar17 = local_58;
          if ((int)local_44 < 0 || (uint)local_58 <= local_44) {
            fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                    ,0x235);
            fprintf(_stderr,
                    "Expression: iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex), Description: SignaledObjIndex object out of range [index=%d obj_count=%u\n"
                    ,local_60 & 0xffffffff,uVar17 & 0xffffffff);
          }
          if ((int)local_44 < 0) {
            piVar11 = __errno_location();
            *piVar11 = 0x54f;
            DVar9 = 0xffffffff;
          }
          else {
            DVar9 = local_44 + DVar9;
          }
        }
      }
    }
    else {
      if (0 < iVar10) {
        uVar20 = 0;
        do {
          pIVar2 = ppIVar16[uVar20];
          if (pIVar2 == (IPalObject *)0x0) break;
          (*pIVar2->_vptr_IPalObject[3])();
          ppIVar16[uVar20] = (IPalObject *)0x0;
          uVar20 = uVar20 + 1;
        } while ((uVar17 & 0xffffffff) != uVar20);
      }
      iVar6 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
      if (iVar6 != 0) {
        fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                ,400);
        fprintf(_stderr,"Awakened for APC, but no APC is pending\n");
        goto LAB_002cc395;
      }
      DVar9 = 0xc0;
    }
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002cc961;
LAB_002cc395:
    piVar11 = __errno_location();
    *piVar11 = 0x54f;
    DVar9 = 0xffffffff;
  }
LAB_002cc3aa:
  nCount = (DWORD)local_58;
  puVar12 = puStack_38;
  ppIVar16 = _fValue;
  if (0 < (int)nCount) {
    uVar17 = local_58 & 0xffffffff;
    uVar20 = 0;
    do {
      (**(code **)(*(long *)puStack_38[uVar20] + 0x40))((long *)puStack_38[uVar20],pThread);
      puStack_38[uVar20] = 0;
      uVar20 = uVar20 + 1;
      puVar12 = puStack_38;
      ppIVar16 = _fValue;
    } while (uVar17 != uVar20);
  }
LAB_002cc3fe:
  if (0x10 < nCount) {
    if (puVar12 != (ulong *)0x0) {
      InternalFree(puVar12 + -1);
    }
    if (ppIVar16 != (IPalObject **)0x0) {
      InternalFree(ppIVar16 + -1);
    }
  }
  return DVar9;
}

Assistant:

DWORD CorUnix::InternalWaitForMultipleObjectsEx(
    CPalThread * pThread,
    DWORD nCount,
    CONST HANDLE *lpHandles,
    BOOL bWaitAll,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    DWORD dwRet = WAIT_FAILED;
    PAL_ERROR palErr = NO_ERROR;
    int i, iSignaledObjCount, iSignaledObjIndex = -1;
    bool fWAll = (bool)bWaitAll, fNeedToBlock  = false;
    bool fAbandoned = false;
    WaitType wtWaitType;

    IPalObject            * pIPalObjStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    ISynchWaitController  * pISyncStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    IPalObject           ** ppIPalObjs = pIPalObjStackArray;
    ISynchWaitController ** ppISyncWaitCtrlrs = pISyncStackArray;

    if ((nCount == 0) || (nCount > MAXIMUM_WAIT_OBJECTS))
    {
        ppIPalObjs = NULL;        // make delete at the end safe
        ppISyncWaitCtrlrs = NULL; // make delete at the end safe
        ERROR("Invalid object count=%d [range: 1 to %d]\n",
               nCount, MAXIMUM_WAIT_OBJECTS);
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        goto WFMOExIntExit;
    }
    else if (nCount == 1)
    {
        fWAll = false;  // makes no difference when nCount is 1
        wtWaitType = SingleObject;
    }
    else
    {
        wtWaitType = fWAll ? MultipleObjectsWaitAll : MultipleObjectsWaitOne;
        if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
        {
            ppIPalObjs = InternalNewArray<IPalObject*>(nCount);
            ppISyncWaitCtrlrs = InternalNewArray<ISynchWaitController*>(nCount);
            if ((NULL == ppIPalObjs) || (NULL == ppISyncWaitCtrlrs))
            {
                ERROR("Out of memory allocating internal structures\n");
                pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto WFMOExIntExit;
            }
        }
    }

    palErr = g_pObjectManager->ReferenceMultipleObjectsByHandleArray(pThread,
                                                                     (VOID **)lpHandles,
                                                                     nCount,
                                                                     &sg_aotWaitObject,
                                                                     SYNCHRONIZE,
                                                                     ppIPalObjs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain object for some or all of the handles [error=%u]\n",
              palErr);
        if (palErr == ERROR_INVALID_HANDLE)
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        else
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntExit;
    }

    if (fWAll)
    {
        // For a wait-all operation, check for duplicate wait objects in the array. This just uses a brute-force O(n^2)
        // algorithm, but since MAXIMUM_WAIT_OBJECTS is small, the worst case is not so bad, and the average case would involve
        // significantly fewer items.
        for (DWORD i = 0; i < nCount - 1; ++i)
        {
            IPalObject *const objectToCheck = ppIPalObjs[i];
            for (DWORD j = i + 1; j < nCount; ++j)
            {
                if (ppIPalObjs[j] == objectToCheck)
                {
                    ERROR("Duplicate handle provided for a wait-all operation [error=%u]\n", ERROR_INVALID_PARAMETER);
                    pThread->SetLastError(ERROR_INVALID_PARAMETER);
                    goto WFMOExIntCleanup;
                }
            }
        }
    }

    palErr = g_pSynchronizationManager->GetSynchWaitControllersForObjects(
        pThread, ppIPalObjs, nCount, ppISyncWaitCtrlrs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain ISynchWaitController interface for some or all "
              "of the objects [error=%u]\n", palErr);
        pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntCleanup;
    }

    if (bAlertable)
    {
        // First check for pending APC. We need to do that while holding the global
        // synch lock implicitely grabbed by GetSynchWaitControllersForObjects
        if (g_pSynchronizationManager->AreAPCsPending(pThread))
        {
            // If there is any pending APC we need to release the
            // implicit global synch lock before calling into it
            for (i = 0; (i < (int)nCount) && (NULL != ppISyncWaitCtrlrs[i]); i++)
            {
                ppISyncWaitCtrlrs[i]->ReleaseController();
                ppISyncWaitCtrlrs[i] = NULL;
            }
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
            if (NO_ERROR == palErr)
            {
                dwRet = WAIT_IO_COMPLETION;
            }
            else
            {
                ASSERT("Awakened for APC, but no APC is pending\n");
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
                dwRet = WAIT_FAILED;
            }
            goto WFMOExIntCleanup;
        }
    }

    iSignaledObjCount = 0;
    iSignaledObjIndex = -1;
    for (i=0;i<(int)nCount;i++)
    {
        bool fValue;
        palErr = ppISyncWaitCtrlrs[i]->CanThreadWaitWithoutBlocking(&fValue, &fAbandoned);
        if (NO_ERROR != palErr)
        {
            ERROR("ISynchWaitController::CanThreadWaitWithoutBlocking() failed for "
                  "%d-th object [handle=%p error=%u]\n", i, lpHandles[i], palErr);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            goto WFMOExIntReleaseControllers;
        }
        if (fValue)
        {
            iSignaledObjCount++;
            iSignaledObjIndex = i;
            if (!fWAll)
                break;
        }
    }

    fNeedToBlock = (iSignaledObjCount == 0) || (fWAll && (iSignaledObjCount < (int)nCount));
    if (!fNeedToBlock)
    {
        // At least one object signaled, or bWaitAll==TRUE and all object signaled.
        // No need to wait, let's unsignal the object(s) and return without blocking
        int iStartIdx, iEndIdx;

        if (fWAll)
        {
            iStartIdx = 0;
            iEndIdx = nCount;
        }
        else
        {
            iStartIdx = iSignaledObjIndex;
            iEndIdx = iStartIdx + 1;
        }

        // Unsignal objects
        if( iStartIdx < 0 )
        {
            ERROR("Buffer underflow due to iStartIdx < 0");
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        for (i = iStartIdx; i < iEndIdx; i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->ReleaseWaitingThreadWithoutBlocking();
            if (NO_ERROR != palErr)
            {
                ERROR("ReleaseWaitingThreadWithoutBlocking() failed for %d-th "
                      "object [handle=%p error=%u]\n",
                      i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }

        dwRet = (fAbandoned ? WAIT_ABANDONED_0 : WAIT_OBJECT_0);
    }
    else if (0 == dwMilliseconds)
    {
        // Not enough objects signaled, but timeout is zero: no actual wait
        dwRet = WAIT_TIMEOUT;
        fNeedToBlock = false;
    }
    else
    {
        // Register the thread for waiting on all objects
        for (i=0;i<(int)nCount;i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->RegisterWaitingThread(
                                                        wtWaitType,
                                                        i,
                                                        (TRUE == bAlertable));
            if (NO_ERROR != palErr)
            {
                ERROR("RegisterWaitingThread() failed for %d-th object "
                      "[handle=%p error=%u]\n", i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }
    }

WFMOExIntReleaseControllers:
    // Release all controllers before going to sleep
    for (i = 0; i < (int)nCount; i++)
    {
        ppISyncWaitCtrlrs[i]->ReleaseController();
        ppISyncWaitCtrlrs[i] = NULL;
    }
    if (NO_ERROR != palErr)
        goto WFMOExIntCleanup;

    if (fNeedToBlock)
    {
        ThreadWakeupReason twrWakeupReason;

        //
        // Going to sleep
        //
        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        false,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        //
        // Awakened
        //
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            pThread->SetLastError(palErr);
            goto WFMOExIntCleanup;
        }
        switch (twrWakeupReason)
        {
        case WaitSucceeded:
            dwRet = WAIT_OBJECT_0; // offset added later
            break;
        case MutexAbondoned:
            dwRet =  WAIT_ABANDONED_0; // offset added later
            break;
        case WaitTimeout:
            dwRet = WAIT_TIMEOUT;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            dwRet = WAIT_FAILED;
            break;
        }
    }

    if (!fWAll && ((WAIT_OBJECT_0 == dwRet) || (WAIT_ABANDONED_0 == dwRet)))
    {
        _ASSERT_MSG(0 <= iSignaledObjIndex,
                    "Failed to identify signaled/abandoned object\n");
        _ASSERT_MSG(iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex),
                    "SignaledObjIndex object out of range "
                    "[index=%d obj_count=%u\n",
                    iSignaledObjCount, nCount);

        if (iSignaledObjIndex < 0)
        {
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        dwRet += iSignaledObjIndex;
    }

WFMOExIntCleanup:
    for (i = 0; i < (int)nCount; i++)
    {
        ppIPalObjs[i]->ReleaseReference(pThread);
        ppIPalObjs[i] = NULL;
    }

WFMOExIntExit:
    if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
    {
        InternalDeleteArray(ppIPalObjs);
        InternalDeleteArray(ppISyncWaitCtrlrs);
    }

    return dwRet;
}